

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::
FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
::doApply(IRet *__return_storage_ptr__,
         FixedGenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long lVar2;
  long *plVar3;
  undefined8 local_68;
  double dStack_60;
  undefined8 local_58;
  bool *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Void *local_38;
  
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined4 *)pbVar1 = 0;
    *(undefined4 *)(pbVar1 + 4) = 0x7ff00000;
    *(undefined4 *)(pbVar1 + 8) = 0;
    *(undefined4 *)(pbVar1 + 0xc) = 0xfff00000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined4 *)pbVar1 = 0;
    *(undefined4 *)(pbVar1 + 4) = 0x7ff00000;
    *(undefined4 *)(pbVar1 + 8) = 0;
    *(undefined4 *)(pbVar1 + 0xc) = 0xfff00000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  plVar3 = (long *)(**(code **)(*(long *)this + 0x58))(this);
  lVar2 = 0;
  do {
    local_50 = &iargs->a->m_data[0].m_hasNaN + lVar2;
    local_38 = iargs->d;
    local_48 = *(undefined4 *)&iargs->b;
    uStack_44 = *(undefined4 *)((long)&iargs->b + 4);
    uStack_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    (**(code **)(*plVar3 + 0x40))(&local_68,plVar3,ctx,&local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_58;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_68;
    *(double *)(pbVar1 + 8) = dStack_60;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x60);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext& ctx,
												 const IArgs&		iargs) const
	{
		IRet				ret;
		const Func<Sig_>&	func	= this->doGetScalarFunc();

		for (int ndx = 0; ndx < Size; ++ndx)
			ret[ndx] = func.apply(ctx, iargs.a[ndx], iargs.b, iargs.c[ndx], iargs.d[ndx]);

		return ret;
	}